

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O2

bool __thiscall draco::Metadata::GetEntryInt(Metadata *this,string *name,int32_t *value)

{
  bool bVar1;
  const_iterator cVar2;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                  *)this,name);
  if (((_Rb_tree_header *)cVar2._M_node == &(this->entries_)._M_t._M_impl.super__Rb_tree_header) ||
     ((long)cVar2._M_node[2]._M_parent - (long)*(int32_t **)(cVar2._M_node + 2) != 4)) {
    bVar1 = false;
  }
  else {
    *value = **(int32_t **)(cVar2._M_node + 2);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Metadata::GetEntryInt(const std::string &name, int32_t *value) const {
  return GetEntry(name, value);
}